

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O3

BoolAndFTShort __thiscall FreeTypeFaceWrapper::GetxHeightInternal(FreeTypeFaceWrapper *this)

{
  BoolAndFTShort BVar1;
  
  if (this->mFormatParticularWrapper != (IFreeTypeFaceExtender *)0x0) {
    BVar1 = (BoolAndFTShort)(*this->mFormatParticularWrapper->_vptr_IFreeTypeFaceExtender[4])();
    if (((uint)BVar1 & 1) != 0) {
      return BVar1;
    }
  }
  BVar1 = GetYBearingForUnicodeChar(this,0x78);
  return BVar1;
}

Assistant:

BoolAndFTShort FreeTypeFaceWrapper::GetxHeightInternal()
{
	if(mFormatParticularWrapper)
	{
		BoolAndFTShort fontDependentResult = mFormatParticularWrapper->GetxHeight();
		if(fontDependentResult.first)
			return fontDependentResult;
		else
			return XHeightFromLowerXHeight();

	}
	else
		return XHeightFromLowerXHeight();
}